

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  carrier_uint two_f;
  carrier_uint two_f_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  uint uVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  char cVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int in_ESI;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  decimal_fp<double> dVar22;
  cache_entry_type cache;
  uint128_wrapper *local_48 [3];
  
  uVar20 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) == 0) {
    uVar21 = 0xfffffbce;
    if (uVar20 == 0) {
      uVar17 = 0;
      uVar18 = 0;
      goto LAB_003bba7c;
    }
LAB_003bb64d:
    uVar7 = (int)(uVar21 * 0x134413) >> 0x16;
    uVar17 = (ulong)uVar7;
    iVar10 = uVar7 - 2;
    local_48[0] = cache_accessor<double>::get_cached_power
                            ((uint128_wrapper *)(ulong)(2 - uVar7),in_ESI);
    iVar19 = ((int)((2 - uVar7) * 0x1a934f) >> 0x13) + uVar21;
    two_f_00 = uVar20 * 2;
    two_f = uVar20 * 2 + 1;
    uVar18 = two_f << ((byte)iVar19 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = extraout_RDX;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_48[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar18;
    uVar16 = SUB168(auVar1 * auVar4,8) +
             (ulong)CARRY8(SUB168(auVar2 * auVar5,8),SUB168(auVar1 * auVar4,0));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    uVar18 = SUB168(auVar3 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
    uVar8 = (int)uVar18 * -1000;
    uVar14 = (int)uVar16 + uVar8;
    uVar13 = (uint)(extraout_RDX >> (~(byte)iVar19 & 0x3f));
    if (uVar13 < uVar14) {
LAB_003bb9e7:
      iVar15 = uVar14 - (uVar13 >> 1);
      uVar8 = iVar15 + 0x32;
      if ((uVar8 & 3) == 0) {
        uVar8 = (uVar8 >> 2) * 0xa429;
        uVar18 = uVar18 * 10 + (ulong)(uVar8 >> 0x14);
        if ((uVar8 & 0xff) < 0xb) {
          bVar6 = cache_accessor<double>::compute_mul_parity
                            (two_f_00,(cache_entry_type *)local_48,iVar19);
          if (bVar6 == (bool)((byte)iVar15 & 1)) {
            bVar6 = is_center_integer<double>(two_f_00,uVar21,iVar10);
            if (bVar6) {
              uVar18 = uVar18 & 0xfffffffffffffffe;
            }
          }
          else {
            uVar18 = uVar18 - 1;
          }
        }
      }
      else {
        if (1000 < uVar8) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                      ,0x713,"n is too large");
        }
        uVar18 = uVar18 * 10 + (ulong)(uVar8 * 0xa3d8 >> 0x16);
      }
      goto LAB_003bba7c;
    }
    if (uVar14 < uVar13) {
      if ((uVar14 == 0) && ((uVar20 & 1) != 0)) {
        bVar6 = is_endpoint_integer<double>(two_f,uVar21,iVar10);
        uVar8 = (uint)CONCAT71(extraout_var,bVar6);
        if (bVar6) {
          uVar18 = uVar18 - 1;
          uVar14 = 1000;
          goto LAB_003bb9e7;
        }
      }
    }
    else {
      if ((uVar20 & 1) == 0) {
        bVar6 = is_endpoint_integer<double>(two_f_00 - 1,uVar21,iVar10);
        uVar8 = (uint)CONCAT71(extraout_var_00,bVar6);
        if (bVar6) goto LAB_003bb805;
      }
      bVar6 = cache_accessor<double>::compute_mul_parity
                        (two_f_00 - 1,(cache_entry_type *)local_48,iVar19);
      uVar8 = (uint)CONCAT71(extraout_var_01,bVar6);
      if (!bVar6) goto LAB_003bb9e7;
    }
LAB_003bb805:
    iVar10 = uVar7 + 1;
    uVar20 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar7 = (uint)uVar20;
    uVar21 = 0x10;
    if (uVar7 < 0x10) {
      uVar21 = uVar7;
    }
    if (7 < uVar20) {
      uVar17 = uVar18 * -0x3898f8b4dd16f1df;
      if (uVar17 < 0x2af31dc46119) {
        uVar18 = uVar17 >> 8;
        uVar13 = (uint)(uVar17 >> 8);
        uVar8 = 8;
        if (uVar7 != 8) {
          uVar14 = 9;
          if (9 < uVar21) {
            uVar14 = uVar21;
          }
          uVar21 = 8;
          do {
            uVar11 = (uint)uVar18 * -0x33333333;
            uVar13 = (uint)uVar18;
            uVar8 = uVar21;
            if (0x33333333 < uVar11) break;
            uVar21 = uVar21 + 1;
            uVar18 = (ulong)uVar11;
            uVar13 = uVar11;
            uVar8 = uVar14;
          } while (uVar14 != uVar21);
        }
        uVar18 = (ulong)(uVar13 >> ((char)uVar8 - 8U & 0x1f));
      }
      if (uVar17 < 0x2af31dc46119) goto LAB_003bb9da;
    }
    uVar8 = 0;
    if (uVar20 != 0) {
      uVar20 = uVar18 / 100000000;
      iVar19 = (int)uVar20 * -100000000 + (int)uVar18;
      uVar21 = iVar19 * -0x33333333;
      if (uVar21 < 0x33333334) {
        if ((uVar7 == 1) || (uVar8 = iVar19 * -0x3d70a3d7, 0x33333333 < uVar8)) goto LAB_003bb9d2;
        if ((uVar7 == 2) || (uVar21 = iVar19 * 0x26e978d5, 0x33333333 < uVar21)) {
LAB_003bbacf:
          uVar18 = uVar20 * 1000000 + (ulong)(uVar8 >> 2);
          uVar8 = 2;
        }
        else if ((uVar7 == 3) || (uVar8 = iVar19 * 0x3afb7e91, 0x33333333 < uVar8)) {
LAB_003bbb18:
          uVar18 = uVar20 * 100000 + (ulong)(uVar21 >> 3);
          uVar8 = 3;
        }
        else if ((uVar7 == 4) || (uVar21 = iVar19 * 0xbcbe61d, 0x33333333 < uVar21)) {
LAB_003bbb63:
          uVar18 = uVar20 * 10000 + (ulong)(uVar8 >> 4);
          uVar8 = 4;
        }
        else if ((uVar7 == 5) || (uVar8 = iVar19 * 0x68c26139, 0x33333333 < uVar8)) {
LAB_003bbbac:
          uVar18 = uVar20 * 1000 + (ulong)(uVar21 >> 5);
          uVar8 = 5;
        }
        else if ((uVar7 == 6) || (uVar21 = iVar19 * -0x5172b95b, 0x33333333 < uVar21)) {
LAB_003bbbf1:
          uVar18 = uVar20 * 100 + (ulong)(uVar8 >> 6);
          uVar8 = 6;
        }
        else {
LAB_003bbc10:
          uVar18 = (ulong)(uVar21 >> 7) + uVar20 * 10;
          uVar8 = 7;
        }
      }
    }
  }
  else {
    uVar21 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar20 != 0) {
      uVar20 = uVar20 + 0x10000000000000;
      goto LAB_003bb64d;
    }
    uVar8 = (int)(uVar21 * 0x134413 + -0x7feff) >> 0x16;
    uVar17 = (ulong)uVar8;
    cVar12 = (char)((int)(uVar8 * -0x1a934f) >> 0x13) + (char)uVar21;
    cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)-uVar8,in_ESI);
    bVar9 = 0xb - cVar12;
    uVar16 = (ulong)((uVar21 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar9 & 0x3f));
    uVar18 = ((extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar9 & 0x3f)) / 10;
    uVar20 = uVar18 * 10;
    if (uVar20 < uVar16) {
      uVar20 = (extraout_RDX_00 >> (10U - cVar12 & 0x3f)) + 1 >> 1;
      if (uVar21 == 0xffffffb3) {
        uVar18 = uVar20 & 0xfffffffffffffffe;
      }
      else {
        uVar18 = uVar20 + (uVar20 < uVar16);
      }
      goto LAB_003bba7c;
    }
    iVar10 = uVar8 + 1;
    uVar17 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    uVar7 = (uint)uVar17;
    uVar21 = 0x10;
    if (uVar7 < 0x10) {
      uVar21 = uVar7;
    }
    if (uVar17 < 8) {
LAB_003bb97d:
      uVar8 = 0;
      if (uVar17 == 0) goto LAB_003bb9da;
      uVar20 = uVar18 / 100000000;
      iVar19 = (int)uVar20 * -100000000 + (int)uVar18;
      uVar21 = iVar19 * -0x33333333;
      if (0x33333333 < uVar21) goto LAB_003bb9da;
      if ((uVar7 != 1) && (uVar8 = iVar19 * -0x3d70a3d7, uVar8 < 0x33333334)) {
        if ((uVar7 != 2) && (uVar21 = iVar19 * 0x26e978d5, uVar21 < 0x33333334)) {
          if ((uVar7 != 3) && (uVar8 = iVar19 * 0x3afb7e91, uVar8 < 0x33333334)) {
            if ((uVar7 != 4) && (uVar21 = iVar19 * 0xbcbe61d, uVar21 < 0x33333334)) {
              if ((uVar7 != 5) && (uVar8 = iVar19 * 0x68c26139, uVar8 < 0x33333334)) {
                if ((uVar7 != 6) && (uVar21 = iVar19 * -0x5172b95b, uVar21 < 0x33333334)) {
                  uVar20 = uVar20 & 0xffffffff;
                  goto LAB_003bbc10;
                }
                uVar20 = uVar20 & 0xffffffff;
                goto LAB_003bbbf1;
              }
              uVar20 = uVar20 & 0xffffffff;
              goto LAB_003bbbac;
            }
            uVar20 = uVar20 & 0xffffffff;
            goto LAB_003bbb63;
          }
          uVar20 = uVar20 & 0xffffffff;
          goto LAB_003bbb18;
        }
        uVar20 = uVar20 & 0xffffffff;
        goto LAB_003bbacf;
      }
      uVar20 = uVar20 & 0xffffffff;
LAB_003bb9d2:
      uVar18 = uVar20 * 10000000 + (ulong)(uVar21 >> 1);
      uVar8 = 1;
    }
    else {
      uVar16 = uVar18 * -0x3898f8b4dd16f1df;
      if (uVar16 < 0x2af31dc46119) {
        uVar18 = uVar16 >> 8;
        uVar20 = 8;
        uVar8 = (uint)(uVar16 >> 8);
        if (uVar7 != 8) {
          uVar13 = 9;
          if (9 < uVar21) {
            uVar13 = uVar21;
          }
          uVar20 = 8;
          do {
            uVar21 = (uint)uVar18 * -0x33333333;
            uVar8 = (uint)uVar18;
            if (0x33333333 < uVar21) goto LAB_003bb972;
            uVar8 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar8;
            uVar18 = (ulong)uVar21;
          } while (uVar13 != uVar8);
          uVar20 = (ulong)uVar13;
          uVar8 = uVar21;
        }
LAB_003bb972:
        uVar18 = (ulong)(uVar8 >> ((char)uVar20 - 8U & 0x1f));
      }
      uVar8 = (uint)uVar20;
      if (0x2af31dc46118 < uVar16) goto LAB_003bb97d;
    }
  }
LAB_003bb9da:
  uVar17 = (ulong)(iVar10 + uVar8);
LAB_003bba7c:
  dVar22._8_8_ = uVar17;
  dVar22.significand = uVar18;
  return dVar22;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}